

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

tommy_tree_node * tommy_tree_search_node(undefined1 *cmp,tommy_tree_node *root,void *data)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int c;
  void *data_local;
  tommy_tree_node *root_local;
  undefined1 *cmp_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root == (tommy_tree_node *)0x0) {
    cmp_local = (undefined1 *)0x0;
  }
  else {
    iVar2 = (*(code *)cmp)(data,root->data);
    if (iVar2 < 0) {
      cmp_local = (undefined1 *)tommy_tree_search_node(cmp,root->prev,data);
    }
    else {
      cmp_local = (undefined1 *)root;
      if (0 < iVar2) {
        cmp_local = (undefined1 *)tommy_tree_search_node(cmp,root->next,data);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (tommy_tree_node *)cmp_local;
}

Assistant:

static tommy_tree_node* tommy_tree_search_node(tommy_compare_func* cmp, tommy_tree_node* root, void* data)
{
	int c;

	if (!root)
		return 0;

	c = cmp(data, root->data);

	if (c < 0)
		return tommy_tree_search_node(cmp, root->prev, data);

	if (c > 0)
		return tommy_tree_search_node(cmp, root->next, data);

	return root;
}